

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockfilter_index_tests.cpp
# Opt level: O3

void __thiscall
blockfilter_index_tests::blockfilter_index_init_destroy::test_method
          (blockfilter_index_init_destroy *this)

{
  function<std::unique_ptr<interfaces::Chain,_std::default_delete<interfaces::Chain>_>_()>
  make_chain;
  function<std::unique_ptr<interfaces::Chain,_std::default_delete<interfaces::Chain>_>_()>
  make_chain_00;
  function<void_(BlockFilterIndex_&)> fn;
  function<std::unique_ptr<interfaces::Chain,_std::default_delete<interfaces::Chain>_>_()>
  make_chain_01;
  readonly_property65 rVar1;
  bool bVar2;
  readonly_property<bool> rVar3;
  BlockFilterIndex *pBVar4;
  iterator in_R8;
  iterator pvVar5;
  iterator in_R9;
  iterator pvVar6;
  long in_FS_OFFSET;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string file_04;
  const_string file_05;
  const_string file_06;
  const_string file_07;
  const_string file_08;
  const_string file_09;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  const_string msg_06;
  const_string msg_07;
  const_string msg_08;
  const_string msg_09;
  int iter_count;
  undefined4 uVar7;
  undefined4 uVar8;
  BlockFilterType BVar9;
  check_type cVar12;
  char *pcVar10;
  _Manager_type in_stack_fffffffffffffc78;
  lazy_ostream *assertion_descr;
  _Invoker_type in_stack_fffffffffffffc80;
  _Invoker_type p_Var11;
  char *local_360;
  char *local_358;
  undefined1 *local_350;
  undefined1 *local_348;
  char *local_340;
  char *local_338;
  char *local_330;
  char *local_328;
  blockfilter_index_init_destroy *local_320;
  undefined8 local_318;
  code *local_310;
  code *local_308;
  undefined1 *local_300;
  undefined1 *local_2f8;
  char *local_2f0;
  char *local_2e8;
  char *local_2e0;
  char *local_2d8;
  undefined1 *local_2d0;
  undefined1 *local_2c8;
  char *local_2c0;
  char *local_2b8;
  char *local_2b0;
  char *local_2a8;
  undefined1 *local_2a0;
  undefined1 *local_298;
  char *local_290;
  char *local_288;
  char *local_280;
  char *local_278;
  undefined1 *local_270;
  undefined1 *local_268;
  char *local_260;
  char *local_258;
  undefined4 local_24c;
  undefined1 local_248 [16];
  undefined1 *local_238;
  char *local_230;
  undefined1 *local_228;
  undefined1 *local_220;
  char *local_218;
  char *local_210;
  int *local_208;
  undefined8 local_200;
  code *local_1f8;
  code *local_1f0;
  int local_1e4;
  char *local_1e0;
  char *local_1d8;
  blockfilter_index_init_destroy *local_1d0;
  undefined8 local_1c8;
  code *local_1c0;
  code *local_1b8;
  undefined1 *local_1b0;
  undefined1 *local_1a8;
  char *local_1a0;
  char *local_198;
  char *local_190;
  char *local_188;
  undefined1 *local_180;
  undefined1 *local_178;
  char *local_170;
  char *local_168;
  char *local_160;
  char *local_158;
  undefined1 *local_150;
  undefined1 *local_148;
  char *local_140;
  char *local_138;
  char *local_130;
  char *local_128;
  blockfilter_index_init_destroy *local_120;
  undefined8 local_118;
  code *local_110;
  code *local_108;
  undefined1 *local_100;
  undefined1 *local_f8;
  char *local_f0;
  char *local_e8;
  char *local_e0;
  char *local_d8;
  undefined1 *local_d0;
  undefined1 *local_c8;
  char *local_c0;
  char *local_b8;
  undefined4 *local_b0;
  undefined **local_a8;
  element_type *local_a0;
  shared_count sStack_98;
  undefined4 **local_90;
  int *local_88;
  lazy_ostream local_80;
  undefined1 *local_70;
  lazy_ostream *local_68;
  char *local_60;
  char *local_58;
  assertion_result local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pBVar4 = GetBlockFilterIndex(BASIC);
  local_c0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/blockfilter_index_tests.cpp"
  ;
  local_b8 = "";
  local_d0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_c8 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x116;
  file.m_begin = (iterator)&local_c0;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_d0,msg);
  local_a0 = (element_type *)0x0;
  sStack_98.pi_ = (sp_counted_base *)0x0;
  local_68 = (lazy_ostream *)local_248;
  local_248._0_8_ = "filter_index == nullptr";
  local_248._8_8_ = "";
  local_80.m_empty = false;
  local_80._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01389048;
  local_70 = boost::unit_test::lazy_ostream::inst;
  local_e0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/blockfilter_index_tests.cpp"
  ;
  local_d8 = "";
  uVar7 = 0;
  uVar8 = 0;
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x0;
  local_a8._0_1_ = (class_property<bool>)(class_property<bool>)(pBVar4 == (BlockFilterIndex *)0x0);
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_a8,&local_80,1,0,WARN,_cVar12,(size_t)&local_e0,0x116);
  boost::detail::shared_count::~shared_count(&sStack_98);
  local_f0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/blockfilter_index_tests.cpp"
  ;
  local_e8 = "";
  local_100 = &boost::unit_test::basic_cstring<char_const>::null;
  local_f8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0x118;
  file_00.m_begin = (iterator)&local_f0;
  msg_00.m_end = pvVar6;
  msg_00.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_100,
             msg_00);
  local_118 = 0;
  local_108 = std::
              _Function_handler<std::unique_ptr<interfaces::Chain,_std::default_delete<interfaces::Chain>_>_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/blockfilter_index_tests.cpp:280:5)>
              ::_M_invoke;
  local_110 = std::
              _Function_handler<std::unique_ptr<interfaces::Chain,_std::default_delete<interfaces::Chain>_>_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/blockfilter_index_tests.cpp:280:5)>
              ::_M_manager;
  make_chain.super__Function_base._M_functor._4_4_ = uVar8;
  make_chain.super__Function_base._M_functor._0_4_ = uVar7;
  make_chain.super__Function_base._M_functor._8_8_ = (undefined8)_cVar12;
  make_chain.super__Function_base._M_manager = in_stack_fffffffffffffc78;
  make_chain._M_invoker = (_Invoker_type)in_stack_fffffffffffffc80;
  local_120 = this;
  rVar1.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       InitBlockFilterIndex(make_chain,(BlockFilterType)&local_120,0,false,true);
  local_a8 = (undefined **)
             CONCAT71(local_a8._1_7_,
                      rVar1.super_readonly_property<bool>.super_class_property<bool>.value);
  local_a0 = (element_type *)0x0;
  sStack_98.pi_ = (sp_counted_base *)0x0;
  local_248._0_8_ =
       "InitBlockFilterIndex([&]{ return interfaces::MakeChain(m_node); }, BlockFilterType::BASIC, 1 << 20, true, false)"
  ;
  local_248._8_8_ = "";
  local_80.m_empty = false;
  local_80._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01389048;
  local_70 = boost::unit_test::lazy_ostream::inst;
  local_68 = (lazy_ostream *)local_248;
  local_130 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/blockfilter_index_tests.cpp"
  ;
  local_128 = "";
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_a8,&local_80,1,0,WARN,_cVar12,(size_t)&local_130,0x118);
  boost::detail::shared_count::~shared_count(&sStack_98);
  if (local_110 != (code *)0x0) {
    (*local_110)(&local_120,&local_120,3);
  }
  pBVar4 = GetBlockFilterIndex(BASIC);
  local_140 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/blockfilter_index_tests.cpp"
  ;
  local_138 = "";
  local_150 = &boost::unit_test::basic_cstring<char_const>::null;
  local_148 = &boost::unit_test::basic_cstring<char_const>::null;
  file_01.m_end = (iterator)0x11b;
  file_01.m_begin = (iterator)&local_140;
  msg_01.m_end = pvVar6;
  msg_01.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_150,
             msg_01);
  local_a0 = (element_type *)0x0;
  sStack_98.pi_ = (sp_counted_base *)0x0;
  local_248._0_8_ = "filter_index != nullptr";
  local_248._8_8_ = "";
  local_80.m_empty = false;
  local_80._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01389048;
  local_70 = boost::unit_test::lazy_ostream::inst;
  local_160 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/blockfilter_index_tests.cpp"
  ;
  local_158 = "";
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x0;
  local_68 = (lazy_ostream *)local_248;
  local_a8._0_1_ = (class_property<bool>)(class_property<bool>)(pBVar4 != (BlockFilterIndex *)0x0);
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_a8,&local_80,1,0,WARN,_cVar12,(size_t)&local_160,0x11b);
  boost::detail::shared_count::~shared_count(&sStack_98);
  local_170 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/blockfilter_index_tests.cpp"
  ;
  local_168 = "";
  local_180 = &boost::unit_test::basic_cstring<char_const>::null;
  local_178 = &boost::unit_test::basic_cstring<char_const>::null;
  file_02.m_end = (iterator)0x11c;
  file_02.m_begin = (iterator)&local_170;
  msg_02.m_end = pvVar6;
  msg_02.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_180,
             msg_02);
  local_a8._0_1_ = (class_property<bool>)(pBVar4->m_filter_type == BASIC);
  local_a0 = (element_type *)0x0;
  sStack_98.pi_ = (sp_counted_base *)0x0;
  local_248._0_8_ = "filter_index->GetFilterType() == BlockFilterType::BASIC";
  local_248._8_8_ = "";
  local_80.m_empty = false;
  local_80._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01389048;
  local_70 = boost::unit_test::lazy_ostream::inst;
  local_190 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/blockfilter_index_tests.cpp"
  ;
  local_188 = "";
  uVar7 = 0;
  uVar8 = 0;
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x0;
  local_68 = (lazy_ostream *)local_248;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_a8,&local_80,1,0,WARN,_cVar12,(size_t)&local_190,0x11c);
  boost::detail::shared_count::~shared_count(&sStack_98);
  local_1a0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/blockfilter_index_tests.cpp"
  ;
  local_198 = "";
  local_1b0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1a8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_03.m_end = (iterator)0x11f;
  file_03.m_begin = (iterator)&local_1a0;
  msg_03.m_end = pvVar6;
  msg_03.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_1b0,
             msg_03);
  local_1c8 = 0;
  local_1b8 = std::
              _Function_handler<std::unique_ptr<interfaces::Chain,_std::default_delete<interfaces::Chain>_>_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/blockfilter_index_tests.cpp:287:5)>
              ::_M_invoke;
  local_1c0 = std::
              _Function_handler<std::unique_ptr<interfaces::Chain,_std::default_delete<interfaces::Chain>_>_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/blockfilter_index_tests.cpp:287:5)>
              ::_M_manager;
  make_chain_00.super__Function_base._M_functor._4_4_ = uVar8;
  make_chain_00.super__Function_base._M_functor._0_4_ = uVar7;
  make_chain_00.super__Function_base._M_functor._8_8_ = (undefined8)_cVar12;
  make_chain_00.super__Function_base._M_manager = in_stack_fffffffffffffc78;
  make_chain_00._M_invoker = (_Invoker_type)in_stack_fffffffffffffc80;
  local_1d0 = this;
  bVar2 = InitBlockFilterIndex(make_chain_00,(BlockFilterType)&local_1d0,0,false,true);
  local_a8 = (undefined **)CONCAT71(local_a8._1_7_,!bVar2);
  local_a0 = (element_type *)0x0;
  sStack_98.pi_ = (sp_counted_base *)0x0;
  local_248._0_8_ =
       "!InitBlockFilterIndex([&]{ return interfaces::MakeChain(m_node); }, BlockFilterType::BASIC, 1 << 20, true, false)"
  ;
  local_248._8_8_ = "";
  assertion_descr = &local_80;
  local_80.m_empty = false;
  local_80._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01389048;
  local_70 = boost::unit_test::lazy_ostream::inst;
  local_1e0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/blockfilter_index_tests.cpp"
  ;
  local_1d8 = "";
  uVar7 = 0;
  uVar8 = 0;
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x0;
  local_68 = (lazy_ostream *)local_248;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_a8,assertion_descr,1,0,WARN,_cVar12,(size_t)&local_1e0,0x11f
            );
  boost::detail::shared_count::~shared_count(&sStack_98);
  if (local_1c0 != (code *)0x0) {
    (*local_1c0)(&local_1d0,&local_1d0,3);
  }
  local_1e4 = 0;
  local_200 = 0;
  local_1f0 = std::
              _Function_handler<void_(BlockFilterIndex_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/blockfilter_index_tests.cpp:290:29)>
              ::_M_invoke;
  local_1f8 = std::
              _Function_handler<void_(BlockFilterIndex_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/blockfilter_index_tests.cpp:290:29)>
              ::_M_manager;
  fn.super__Function_base._M_functor._4_4_ = uVar8;
  fn.super__Function_base._M_functor._0_4_ = uVar7;
  fn.super__Function_base._M_functor._8_8_ = (undefined8)_cVar12;
  fn.super__Function_base._M_manager = in_stack_fffffffffffffc78;
  fn._M_invoker = in_stack_fffffffffffffc80;
  local_208 = &local_1e4;
  ForEachBlockFilterIndex(fn);
  if (local_1f8 != (code *)0x0) {
    (*local_1f8)(&local_208,&local_208,3);
  }
  local_218 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/blockfilter_index_tests.cpp"
  ;
  local_210 = "";
  local_228 = &boost::unit_test::basic_cstring<char_const>::null;
  local_220 = &boost::unit_test::basic_cstring<char_const>::null;
  file_04.m_end = (iterator)0x123;
  file_04.m_begin = (iterator)&local_218;
  msg_04.m_end = pvVar6;
  msg_04.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_228,
             msg_04);
  local_248._8_8_ = local_248._8_8_ & 0xffffffffffffff00;
  local_248._0_8_ = &PTR__lazy_ostream_01388f08;
  local_238 = boost::unit_test::lazy_ostream::inst;
  local_230 = "";
  local_50.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(local_1e4 == 1);
  local_b0 = &local_24c;
  local_24c = 1;
  local_50.m_message.px = (element_type *)0x0;
  local_50.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_60 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/blockfilter_index_tests.cpp"
  ;
  local_58 = "";
  local_68 = (lazy_ostream *)&local_88;
  local_80.m_empty = false;
  local_80._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013890c8;
  local_70 = boost::unit_test::lazy_ostream::inst;
  local_90 = &local_b0;
  local_a0 = (element_type *)((ulong)local_a0 & 0xffffffffffffff00);
  local_a8 = &PTR__lazy_ostream_013890c8;
  sStack_98.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  p_Var11 = (_Invoker_type)0xf4b8e1;
  pcVar10 = "iter_count";
  BVar9 = BASIC;
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x2;
  local_88 = &local_1e4;
  boost::test_tools::tt_detail::report_assertion
            (&local_50,(lazy_ostream *)local_248,1,2,REQUIRE,0xe41b52,(size_t)&local_60,0x123,
             assertion_descr,"1",(assertion_result *)&local_a8);
  boost::detail::shared_count::~shared_count(&local_50.m_message.pn);
  local_260 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/blockfilter_index_tests.cpp"
  ;
  local_258 = "";
  local_270 = &boost::unit_test::basic_cstring<char_const>::null;
  local_268 = &boost::unit_test::basic_cstring<char_const>::null;
  file_05.m_end = (iterator)0x125;
  file_05.m_begin = (iterator)&local_260;
  msg_05.m_end = pvVar6;
  msg_05.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,(size_t)&local_270,
             msg_05);
  rVar3.super_class_property<bool>.value = (class_property<bool>)DestroyBlockFilterIndex(BVar9);
  local_a0 = (element_type *)0x0;
  sStack_98.pi_ = (sp_counted_base *)0x0;
  local_248._0_8_ = "DestroyBlockFilterIndex(BlockFilterType::BASIC)";
  local_248._8_8_ = "";
  local_80.m_empty = false;
  local_80._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01389048;
  local_70 = boost::unit_test::lazy_ostream::inst;
  local_280 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/blockfilter_index_tests.cpp"
  ;
  local_278 = "";
  BVar9 = BASIC;
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x0;
  local_68 = (lazy_ostream *)local_248;
  local_a8._0_1_ = rVar3.super_class_property<bool>.value;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_a8,&local_80,1,0,WARN,(check_type)pcVar10,(size_t)&local_280
             ,0x125);
  boost::detail::shared_count::~shared_count(&sStack_98);
  local_290 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/blockfilter_index_tests.cpp"
  ;
  local_288 = "";
  local_2a0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_298 = &boost::unit_test::basic_cstring<char_const>::null;
  file_06.m_end = (iterator)0x128;
  file_06.m_begin = (iterator)&local_290;
  msg_06.m_end = pvVar6;
  msg_06.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_06,(size_t)&local_2a0,
             msg_06);
  bVar2 = DestroyBlockFilterIndex(BVar9);
  local_a8._0_1_ = (class_property<bool>)!bVar2;
  local_a0 = (element_type *)0x0;
  sStack_98.pi_ = (sp_counted_base *)0x0;
  local_248._0_8_ = "!DestroyBlockFilterIndex(BlockFilterType::BASIC)";
  local_248._8_8_ = "";
  local_80.m_empty = false;
  local_80._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01389048;
  local_70 = boost::unit_test::lazy_ostream::inst;
  local_2b0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/blockfilter_index_tests.cpp"
  ;
  local_2a8 = "";
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x0;
  local_68 = (lazy_ostream *)local_248;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_a8,&local_80,1,0,WARN,(check_type)pcVar10,(size_t)&local_2b0
             ,0x128);
  boost::detail::shared_count::~shared_count(&sStack_98);
  pBVar4 = GetBlockFilterIndex(BASIC);
  local_2c0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/blockfilter_index_tests.cpp"
  ;
  local_2b8 = "";
  local_2d0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2c8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_07.m_end = (iterator)0x12b;
  file_07.m_begin = (iterator)&local_2c0;
  msg_07.m_end = pvVar6;
  msg_07.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_07,(size_t)&local_2d0,
             msg_07);
  local_a8._0_1_ = (class_property<bool>)(pBVar4 == (BlockFilterIndex *)0x0);
  local_a0 = (element_type *)0x0;
  sStack_98.pi_ = (sp_counted_base *)0x0;
  local_248._0_8_ = "filter_index == nullptr";
  local_248._8_8_ = "";
  local_80.m_empty = false;
  local_80._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01389048;
  local_70 = boost::unit_test::lazy_ostream::inst;
  local_2e0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/blockfilter_index_tests.cpp"
  ;
  local_2d8 = "";
  uVar7 = 0;
  uVar8 = 0;
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x0;
  local_68 = (lazy_ostream *)local_248;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_a8,&local_80,1,0,WARN,(check_type)pcVar10,(size_t)&local_2e0
             ,299);
  boost::detail::shared_count::~shared_count(&sStack_98);
  local_2f0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/blockfilter_index_tests.cpp"
  ;
  local_2e8 = "";
  local_300 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2f8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_08.m_end = (iterator)0x12e;
  file_08.m_begin = (iterator)&local_2f0;
  msg_08.m_end = pvVar6;
  msg_08.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_08,(size_t)&local_300,
             msg_08);
  local_318 = 0;
  local_308 = std::
              _Function_handler<std::unique_ptr<interfaces::Chain,_std::default_delete<interfaces::Chain>_>_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/blockfilter_index_tests.cpp:302:5)>
              ::_M_invoke;
  local_310 = std::
              _Function_handler<std::unique_ptr<interfaces::Chain,_std::default_delete<interfaces::Chain>_>_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/blockfilter_index_tests.cpp:302:5)>
              ::_M_manager;
  make_chain_01.super__Function_base._M_functor._4_4_ = uVar8;
  make_chain_01.super__Function_base._M_functor._0_4_ = uVar7;
  make_chain_01.super__Function_base._M_functor._8_8_ = pcVar10;
  make_chain_01.super__Function_base._M_manager = (_Manager_type)assertion_descr;
  make_chain_01._M_invoker = p_Var11;
  local_320 = this;
  rVar1.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       InitBlockFilterIndex(make_chain_01,(BlockFilterType)&local_320,0,false,true);
  local_a8 = (undefined **)
             CONCAT71(local_a8._1_7_,
                      rVar1.super_readonly_property<bool>.super_class_property<bool>.value);
  local_a0 = (element_type *)0x0;
  sStack_98.pi_ = (sp_counted_base *)0x0;
  local_248._0_8_ =
       "InitBlockFilterIndex([&]{ return interfaces::MakeChain(m_node); }, BlockFilterType::BASIC, 1 << 20, true, false)"
  ;
  local_248._8_8_ = "";
  local_80.m_empty = false;
  local_80._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01389048;
  local_70 = boost::unit_test::lazy_ostream::inst;
  local_68 = (lazy_ostream *)local_248;
  local_330 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/blockfilter_index_tests.cpp"
  ;
  local_328 = "";
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_a8,&local_80,1,0,WARN,(check_type)pcVar10,(size_t)&local_330
             ,0x12e);
  boost::detail::shared_count::~shared_count(&sStack_98);
  if (local_310 != (code *)0x0) {
    (*local_310)(&local_320,&local_320,3);
  }
  DestroyAllBlockFilterIndexes();
  pBVar4 = GetBlockFilterIndex(BASIC);
  local_340 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/blockfilter_index_tests.cpp"
  ;
  local_338 = "";
  local_350 = &boost::unit_test::basic_cstring<char_const>::null;
  local_348 = &boost::unit_test::basic_cstring<char_const>::null;
  file_09.m_end = (iterator)0x133;
  file_09.m_begin = (iterator)&local_340;
  msg_09.m_end = pvVar6;
  msg_09.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_09,(size_t)&local_350,
             msg_09);
  local_a8 = (undefined **)CONCAT71(local_a8._1_7_,pBVar4 == (BlockFilterIndex *)0x0);
  local_a0 = (element_type *)0x0;
  sStack_98.pi_ = (sp_counted_base *)0x0;
  local_248._0_8_ = "filter_index == nullptr";
  local_248._8_8_ = "";
  local_80.m_empty = false;
  local_80._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01389048;
  local_70 = boost::unit_test::lazy_ostream::inst;
  local_68 = (lazy_ostream *)local_248;
  local_360 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/blockfilter_index_tests.cpp"
  ;
  local_358 = "";
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_a8,&local_80,1,0,WARN,(check_type)pcVar10,(size_t)&local_360
             ,0x133);
  boost::detail::shared_count::~shared_count(&sStack_98);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_FIXTURE_TEST_CASE(blockfilter_index_init_destroy, BasicTestingSetup)
{
    BlockFilterIndex* filter_index;

    filter_index = GetBlockFilterIndex(BlockFilterType::BASIC);
    BOOST_CHECK(filter_index == nullptr);

    BOOST_CHECK(InitBlockFilterIndex([&]{ return interfaces::MakeChain(m_node); }, BlockFilterType::BASIC, 1 << 20, true, false));

    filter_index = GetBlockFilterIndex(BlockFilterType::BASIC);
    BOOST_CHECK(filter_index != nullptr);
    BOOST_CHECK(filter_index->GetFilterType() == BlockFilterType::BASIC);

    // Initialize returns false if index already exists.
    BOOST_CHECK(!InitBlockFilterIndex([&]{ return interfaces::MakeChain(m_node); }, BlockFilterType::BASIC, 1 << 20, true, false));

    int iter_count = 0;
    ForEachBlockFilterIndex([&iter_count](BlockFilterIndex& _index) { iter_count++; });
    BOOST_CHECK_EQUAL(iter_count, 1);

    BOOST_CHECK(DestroyBlockFilterIndex(BlockFilterType::BASIC));

    // Destroy returns false because index was already destroyed.
    BOOST_CHECK(!DestroyBlockFilterIndex(BlockFilterType::BASIC));

    filter_index = GetBlockFilterIndex(BlockFilterType::BASIC);
    BOOST_CHECK(filter_index == nullptr);

    // Reinitialize index.
    BOOST_CHECK(InitBlockFilterIndex([&]{ return interfaces::MakeChain(m_node); }, BlockFilterType::BASIC, 1 << 20, true, false));

    DestroyAllBlockFilterIndexes();

    filter_index = GetBlockFilterIndex(BlockFilterType::BASIC);
    BOOST_CHECK(filter_index == nullptr);
}